

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

int glucose_solver_addclause(SimpSolver *S,int *plits,int nlits)

{
  bool bVar1;
  int iVar2;
  Lit p;
  vec<Gluco::Lit> lits;
  
  iVar2 = 0;
  if (nlits < 1) {
    nlits = 0;
  }
  lits.data = (Lit *)0x0;
  lits.sz = 0;
  lits.cap = 0;
  for (; iVar2 != nlits; iVar2 = iVar2 + 1) {
    while ((S->super_Solver).vardata.sz <= *plits / 2) {
      Gluco::SimpSolver::newVar(S,true,true);
    }
    p.x = *plits;
    Gluco::vec<Gluco::Lit>::push(&lits,&p);
    plits = plits + 1;
  }
  bVar1 = Gluco::SimpSolver::addClause(S,&lits);
  Gluco::vec<Gluco::Lit>::~vec(&lits);
  return (uint)bVar1;
}

Assistant:

int glucose_solver_addclause(Gluco::SimpSolver* S, int * plits, int nlits)
{
    vec<Lit> lits;
    for ( int i = 0; i < nlits; i++,plits++)
    {
        // note: Glucose uses the same var->lit conventiaon as ABC
        while ((*plits)/2 >= S->nVars()) S->newVar();
        assert((*plits)/2 < S->nVars()); // NOTE: since we explicitely use new function bmc_add_var
        Lit p;
        p.x = *plits;
        lits.push(p);
    }
    return S->addClause(lits); // returns 0 if the problem is UNSAT
}